

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.h
# Opt level: O2

int MatchSyntaxPattern(KonohaContext *kctx,kNode *node,KTokenSeq *tokens,KTokenSeq *patterns,
                      kToken **errRuleRef)

{
  uint uVar1;
  kToken *pkVar2;
  int iVar3;
  int iVar4;
  kNameSpace *pkVar5;
  kSyntax *syn;
  kToken *pkVar6;
  long lVar7;
  int beginIdx;
  long local_b0;
  KTokenSeq nrule;
  KTokenSeq ntokens;
  
  lVar7 = (long)patterns->beginIdx;
  beginIdx = tokens->beginIdx;
  pkVar5 = kNode_GetNameSpace(kctx,node);
  local_b0 = lVar7;
  do {
    local_b0 = local_b0 + 1;
    if (patterns->endIdx <= lVar7) {
      return beginIdx;
    }
    pkVar6 = (kToken *)(patterns->tokenList->field_2).unboxItems[lVar7];
    do {
      if (tokens->endIdx <= beginIdx) {
        while( true ) {
          if (patterns->endIdx <= local_b0) {
            return beginIdx;
          }
          if ((pkVar6->symbol != 0x60000008) && (((pkVar6->h).magicflag & 0x100) == 0)) break;
          pkVar6 = (kToken *)(patterns->tokenList->field_2).unboxItems[local_b0];
          local_b0 = local_b0 + 1;
        }
        *errRuleRef = pkVar6;
        errRuleRef[1] = (kToken *)0x0;
        return -1;
      }
      pkVar2 = (kToken *)(tokens->tokenList->field_2).unboxItems[beginIdx];
      errRuleRef[1] = pkVar2;
      uVar1 = pkVar6->symbol;
      if (uVar1 < 0xe0000000) {
        if (uVar1 == 0x60000008) {
          nrule.tokenList = (pkVar6->field_2).GroupTokenList;
          nrule.beginIdx = 1;
          nrule.endIdx = (int)((nrule.tokenList)->bytesize >> 3) + -1;
          nrule.field_4.SourceConfig.openToken = (kToken *)0x0;
          nrule.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
          nrule.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
          tokens->beginIdx = beginIdx;
          nrule.ns = pkVar5;
          iVar4 = MatchSyntaxPattern(kctx,node,tokens,&nrule,errRuleRef);
          *errRuleRef = (kToken *)0x0;
          if (node->nodeType == 0x18) {
            return tokens->endIdx;
          }
          iVar3 = beginIdx;
          if (iVar4 != -1) {
            iVar3 = iVar4;
          }
        }
        else {
          if (uVar1 != pkVar2->symbol) goto LAB_00117852;
          if ((pkVar6->field_3).tokenType - 7 < 2) {
            nrule.tokenList = (pkVar6->field_2).GroupTokenList;
            nrule.beginIdx = 1;
            nrule.endIdx = (int)((nrule.tokenList)->bytesize >> 3) + -1;
            nrule.field_4.SourceConfig.openToken = (kToken *)0x0;
            nrule.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
            nrule.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
            ntokens.tokenList = (pkVar2->field_2).GroupTokenList;
            ntokens.endIdx = (int)((ntokens.tokenList)->bytesize >> 3) + -1;
            ntokens.field_4.SourceConfig.openToken = (kToken *)0x0;
            ntokens.field_4.TargetPolicy.syntaxSymbolPattern = (kSyntax *)0x0;
            ntokens.field_4.SourceConfig.foundErrorToken = (kToken *)0x0;
            nrule.ns = pkVar5;
            ntokens.ns = pkVar5;
            ntokens.beginIdx = nrule.beginIdx;
            iVar3 = MatchSyntaxPattern(kctx,node,&ntokens,&nrule,errRuleRef);
            if (iVar3 == -1) {
              return -1;
            }
          }
          iVar3 = beginIdx + 1;
        }
      }
      else {
        syn = (*kctx->klib->kNameSpace_GetSyntax)(kctx,pkVar5,uVar1);
        iVar3 = ParseSyntaxNode(kctx,syn,node,(pkVar6->field_6).ruleNameSymbol,tokens->tokenList,
                                beginIdx,-1,tokens->endIdx);
        if (iVar3 == -1) {
          if (((pkVar6->h).magicflag & 0x100) == 0) {
LAB_00117852:
            *errRuleRef = pkVar6;
            return -1;
          }
          break;
        }
      }
      beginIdx = iVar3;
    } while (((pkVar6->h).magicflag & 0x100) != 0);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static int MatchSyntaxPattern(KonohaContext *kctx, kNode *node, KTokenSeq *tokens, KTokenSeq *patterns, kToken **errRuleRef)
{
	int patternIdx = patterns->beginIdx, tokenIdx = tokens->beginIdx;
	kNameSpace *ns = kNode_ns(node);
	//KLIB dumpTokenArray(kctx, 0, patterns->tokenList, patterns->beginIdx, patterns->endIdx);
	//KLIB dumpTokenArray(kctx, 0, tokens->tokenList, tokens->beginIdx, tokens->endIdx);
	for(; patternIdx < patterns->endIdx; patternIdx++) {
		kToken *ruleToken = patterns->tokenList->TokenItems[patternIdx];
		L_ReDo:;
		//tokenIdx = TokenUtils_SkipOnlyIndent(tokens->tokenList, tokenIdx, tokens->endIdx);
		//DBG_P("patternIdx=%d, tokenIdx=%d, tokenEndIdx=%d", patternIdx, tokenIdx, tokens->endIdx);
		//KDump(node);
		if(tokenIdx < tokens->endIdx) {
			kToken *tk = tokens->tokenList->TokenItems[tokenIdx];
			errRuleRef[1] = tk;
			if(KSymbol_IsPattern(ruleToken->symbol)) {
				kSyntax *syn = kSyntax_(ns, ruleToken->symbol);
				int nextIdx = ParseSyntaxNode(kctx, syn, node, ruleToken->ruleNameSymbol, tokens->tokenList, tokenIdx, -1, tokens->endIdx);
				if(nextIdx == PatternNoMatch) {
					if(!kToken_Is(MatchPreviousPattern, ruleToken)) {
						errRuleRef[0] = ruleToken;
						return PatternNoMatch;
					}
					continue;  /* to avoid check same rule */
				}
				tokenIdx = nextIdx ;
			}
			else if(ruleToken->symbol == KSymbol_OptionalGroup) {
				KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
				tokens->beginIdx = tokenIdx;
				int nextIdx = MatchSyntaxPattern(kctx, node, tokens, &nrule, errRuleRef);
				errRuleRef[0] = NULL;
				if(kNode_IsError(node)) return tokens->endIdx;
				if(nextIdx != PatternNoMatch) {
					tokenIdx = nextIdx;
				}
			}
			else {
				if(ruleToken->symbol != tk->symbol) {
					errRuleRef[0] = ruleToken;
					return PatternNoMatch;
				}
				if(ruleToken->tokenType == KSymbol_ParenthesisGroup || ruleToken->tokenType == KSymbol_BracketGroup) {
					KTokenSeq nrule = {ns, RangeGroup(ruleToken->GroupTokenList)};
					KTokenSeq ntokens = {ns, RangeGroup(tk->GroupTokenList)};
					int next = MatchSyntaxPattern(kctx, node, &ntokens, &nrule, errRuleRef);
					if(next == PatternNoMatch) {
						return PatternNoMatch;
					}
				}
				tokenIdx++;
			}
			if(kToken_Is(MatchPreviousPattern, ruleToken)) {
				goto L_ReDo;
			}
		}
		else { /* tokenIdx < patterns->endIdx */
			while(patternIdx + 1 < patterns->endIdx) {
				if(ruleToken->symbol != KSymbol_OptionalGroup && !kToken_Is(MatchPreviousPattern,ruleToken)) {
					errRuleRef[0] = ruleToken;
					errRuleRef[1] = NULL;
					return -1;
				}
				patternIdx++;
				ruleToken = patterns->tokenList->TokenItems[patternIdx];
			}
			return tokenIdx;
		}
	}
	return tokenIdx;
}